

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_gen_key(mbedtls_ecp_group_id grp_id,mbedtls_ecp_keypair *key,
                       _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_keypair *key_local;
  mbedtls_ecp_group_id grp_id_local;
  
  key_local._4_4_ = mbedtls_ecp_group_load(&key->grp,grp_id);
  if (key_local._4_4_ == 0) {
    key_local._4_4_ = mbedtls_ecp_gen_keypair(&key->grp,&key->d,&key->Q,f_rng,p_rng);
  }
  return key_local._4_4_;
}

Assistant:

int mbedtls_ecp_gen_key( mbedtls_ecp_group_id grp_id, mbedtls_ecp_keypair *key,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    ECP_VALIDATE_RET( key   != NULL );
    ECP_VALIDATE_RET( f_rng != NULL );

    if( ( ret = mbedtls_ecp_group_load( &key->grp, grp_id ) ) != 0 )
        return( ret );

    return( mbedtls_ecp_gen_keypair( &key->grp, &key->d, &key->Q, f_rng, p_rng ) );
}